

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O1

void __thiscall QDBusListener::populateSignalMap(QDBusListener *this)

{
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  *this_00;
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  ChangeSignal local_98;
  DBusKey local_90;
  QString local_60;
  pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
  local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_signalMap;
  QList<QDBusListener::DBusKey>::clear((QList<QDBusListener::DBusKey> *)this_00);
  QList<QDBusListener::ChangeSignal>::clear(&(this->m_signalMap).c.values);
  qEnvironmentVariable((char *)&local_60);
  if (local_60.d.size != 0) {
    loadJson(this,&local_60);
  }
  if ((this->m_signalMap).c.keys.d.size == 0) {
    QVar5.m_data = (storage_type *)0x16;
    QVar5.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar5);
    qVar4 = local_90.location.d.size;
    pcVar3 = local_90.location.d.ptr;
    pDVar1 = local_90.location.d.d;
    QVar6.m_data = (storage_type *)0xb;
    QVar6.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar6);
    pDVar2 = local_90.location.d.d;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.key.d.d = local_90.location.d.d;
    local_90.key.d.ptr = local_90.location.d.ptr;
    local_90.key.d.size = local_90.location.d.size;
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_98.provider = Kde;
    local_98.setting = ApplicationStyle;
    local_90.location.d.d = pDVar1;
    local_90.location.d.ptr = pcVar3;
    local_90.location.d.size = qVar4;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_48,this_00,&local_90,&local_98);
    if (&(local_90.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.key.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    QVar7.m_data = (storage_type *)0x1a;
    QVar7.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar7);
    qVar4 = local_90.location.d.size;
    pcVar3 = local_90.location.d.ptr;
    pDVar1 = local_90.location.d.d;
    QVar8.m_data = (storage_type *)0xb;
    QVar8.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar8);
    pDVar2 = local_90.location.d.d;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.key.d.d = local_90.location.d.d;
    local_90.key.d.ptr = local_90.location.d.ptr;
    local_90.key.d.size = local_90.location.d.size;
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_98.provider = Kde;
    local_98.setting = Theme;
    local_90.location.d.d = pDVar1;
    local_90.location.d.ptr = pcVar3;
    local_90.location.d.size = qVar4;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_48,this_00,&local_90,&local_98);
    if (&(local_90.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.key.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    QVar9.m_data = (storage_type *)0x1b;
    QVar9.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar9);
    qVar4 = local_90.location.d.size;
    pcVar3 = local_90.location.d.ptr;
    pDVar1 = local_90.location.d.d;
    QVar10.m_data = (storage_type *)0x9;
    QVar10.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar10);
    pDVar2 = local_90.location.d.d;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.key.d.d = local_90.location.d.d;
    local_90.key.d.ptr = local_90.location.d.ptr;
    local_90.key.d.size = local_90.location.d.size;
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_98.provider = Gtk;
    local_98.setting = Theme;
    local_90.location.d.d = pDVar1;
    local_90.location.d.ptr = pcVar3;
    local_90.location.d.size = qVar4;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_48,this_00,&local_90,&local_98);
    if (&(local_90.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.key.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    QVar11.m_data = (storage_type *)0x1a;
    QVar11.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar11);
    qVar4 = local_90.location.d.size;
    pcVar3 = local_90.location.d.ptr;
    pDVar1 = local_90.location.d.d;
    QVar12.m_data = (storage_type *)0xc;
    QVar12.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar12);
    pDVar2 = local_90.location.d.d;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.key.d.d = local_90.location.d.d;
    local_90.key.d.ptr = local_90.location.d.ptr;
    local_90.key.d.size = local_90.location.d.size;
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_98.provider = Gnome;
    local_98.setting = ColorScheme;
    local_90.location.d.d = pDVar1;
    local_90.location.d.ptr = pcVar3;
    local_90.location.d.size = qVar4;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_48,this_00,&local_90,&local_98);
    if (&(local_90.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.key.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    QVar13.m_data = (storage_type *)0x1a;
    QVar13.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar13);
    qVar4 = local_90.location.d.size;
    pDVar1 = local_90.location.d.d;
    QVar14.m_data = (storage_type *)0x8;
    QVar14.m_size = (qsizetype)&local_90;
    QString::fromLatin1(QVar14);
    pDVar2 = local_90.location.d.d;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.key.d.d = local_90.location.d.d;
    local_90.key.d.ptr = local_90.location.d.ptr;
    local_90.key.d.size = local_90.location.d.size;
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_98.provider = Gnome;
    local_98.setting = Contrast;
    local_90.location.d.d = pDVar1;
    local_90.location.d.size = qVar4;
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::try_emplace<QDBusListener::ChangeSignal>(&local_48,this_00,&local_90,&local_98);
    if (&(local_90.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.key.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    qEnvironmentVariable((char *)&local_90);
    if (local_90.location.d.size != 0) {
      saveJson(this,&local_90.location);
    }
    if (&(local_90.location.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_90.location.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_90.location.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusListener::populateSignalMap()
{
    m_signalMap.clear();
    const QString &loadJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS");
    if (!loadJsonFile.isEmpty())
        loadJson(loadJsonFile);
    if (!m_signalMap.isEmpty())
        return;

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.KDE"_L1, "widgetStyle"_L1),
                       ChangeSignal(Provider::Kde, Setting::ApplicationStyle));

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.General"_L1, "ColorScheme"_L1),
                       ChangeSignal(Provider::Kde, Setting::Theme));

    m_signalMap.insert(DBusKey("org.gnome.desktop.interface"_L1, "gtk-theme"_L1),
                       ChangeSignal(Provider::Gtk, Setting::Theme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "color-scheme"_L1),
                       ChangeSignal(Provider::Gnome, Setting::ColorScheme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "contrast"_L1),
                       ChangeSignal(Provider::Gnome, Setting::Contrast));

    const QString &saveJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS_SAVE");
    if (!saveJsonFile.isEmpty())
        saveJson(saveJsonFile);
}